

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

int32 * UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix
                  (ArenaAllocator *allocator,Char *pat,CharCount patLen,int skip)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  int *obj;
  ulong uVar5;
  int *obj_00;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int32 *__dest;
  ulong count;
  
  count = (ulong)patLen;
  if (patLen == 0) {
    obj = (int *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f195ac;
      *puVar4 = 0;
    }
    obj = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&allocator->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,count * 4);
    if (obj == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00f195ac;
      *puVar4 = 0;
    }
  }
  *obj = 0;
  if (1 < patLen) {
    uVar7 = 0;
    uVar5 = 1;
    do {
      uVar6 = (uint)uVar7;
      if (0 < (int)uVar6) {
        do {
          uVar6 = (uint)uVar7;
          if (pat[(int)(uVar6 * skip)] == pat[(uint)((int)uVar5 * skip)]) break;
          uVar6 = obj[uVar7 - 1];
          uVar7 = (ulong)uVar6;
        } while (0 < (int)uVar6);
      }
      uVar6 = uVar6 + (pat[(int)(uVar6 * skip)] == pat[(uint)((int)uVar5 * skip)]);
      uVar7 = (ulong)uVar6;
      obj[uVar5] = uVar6;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count);
  }
  if (patLen == 0) {
    obj_00 = (int *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f195ac;
      *puVar4 = 0;
    }
    obj_00 = (int *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    AllocInternal(&allocator->
                                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  ,count * 4);
    if (obj_00 == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00f195ac;
      *puVar4 = 0;
    }
  }
  *obj_00 = 0;
  if (1 < patLen) {
    uVar6 = 0;
    uVar5 = 1;
    do {
      if (0 < (int)uVar6) {
        do {
          if (pat[(~uVar6 + patLen) * skip] == pat[(~(uint)uVar5 + patLen) * skip]) break;
          uVar6 = obj_00[(ulong)uVar6 - 1];
        } while (0 < (int)uVar6);
      }
      uVar6 = uVar6 + (pat[(~uVar6 + patLen) * skip] == pat[(~(uint)uVar5 + patLen) * skip]);
      obj_00[uVar5] = uVar6;
      uVar5 = uVar5 + 1;
    } while (uVar5 != count);
  }
  __dest = (int32 *)&DAT_00000008;
  uVar6 = patLen + 1;
  if (uVar6 != 0) {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f195ac;
      *puVar4 = 0;
    }
    __dest = (int32 *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      AllocInternal(&allocator->
                                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    ,(ulong)uVar6 << 2);
    if (__dest == (int32 *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00f195ac:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  uVar5 = 0;
  do {
    __dest[uVar5] = patLen - obj[patLen - 1];
    uVar5 = uVar5 + 1;
  } while (uVar6 + (uVar6 == 0) != uVar5);
  if (patLen != 0) {
    uVar5 = 2;
    if (2 < uVar6) {
      uVar5 = (ulong)uVar6;
    }
    uVar7 = 1;
    do {
      uVar6 = patLen - obj_00[uVar7 - 1];
      iVar8 = (int)uVar7 - obj_00[uVar7 - 1];
      if (iVar8 < __dest[uVar6]) {
        __dest[uVar6] = iVar8;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
    memmove(__dest,__dest + 1,count << 2);
  }
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,obj);
  Memory::DeleteArray<Memory::ArenaAllocator,int>(allocator,count,obj_00);
  return __dest;
}

Assistant:

int32 * TextbookBoyerMooreSetup<C>::GetGoodSuffix(ArenaAllocator* allocator, const Char * pat, CharCount patLen, int skip)
    {
        // pat offset q |-> longest prefix of pat which is a proper suffix of pat[0..q]
        // (thanks to equivalence classes being in canonical order we only need to look at the first
        //  character of each skip grouping in the pattern)
        int32* prefix = AnewArray(allocator, int32, patLen);
        prefix[0] = 0;
        int32 k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[k * skip] != pat[q * skip])
                k = prefix[k - 1];
            if (pat[k * skip] == pat[q * skip])
                k++;
            prefix[q] = k;
        }

        // As above, but for rev(pat)
        int32* revPrefix = AnewArray(allocator, int32, patLen);
        revPrefix[0] = 0;
        k = 0;
        for (CharCount q = 1; q < patLen; q++)
        {
            while (k > 0 && pat[(patLen - k - 1) * skip] != pat[(patLen - q - 1) * skip])
                k = revPrefix[k - 1];
            if (pat[(patLen - k - 1) * skip] == pat[(patLen - q - 1) * skip])
                k++;
            revPrefix[q] = k;
        }

        // pat prefix length l |-> least shift s.t. pat[0..l-1] is not mismatched
        int32 * goodSuffix = AnewArray(allocator, int32, patLen + 1);
        for (CharCount j = 0; j <= patLen; j++)
            goodSuffix[j] = patLen - prefix[patLen - 1];
        for (CharCount l = 1; l <= patLen; l++)
        {
            CharCount j = patLen - revPrefix[l - 1];
            int32 s = l - revPrefix[l - 1];
            if (goodSuffix[j] > s)
                goodSuffix[j] = s;
        }
        // shift above one to the left
        for (CharCount j = 0; j < patLen; j++)
            goodSuffix[j] = goodSuffix[j + 1];

        AdeleteArray(allocator, patLen, prefix);
        AdeleteArray(allocator, patLen, revPrefix);

        return goodSuffix;
    }